

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O3

void insertleaf(cbtDbvt *pdbvt,cbtDbvtNode *root,cbtDbvtNode *leaf)

{
  cbtDbvtNode **ppcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  cbtDbvtNode *pcVar5;
  float fVar6;
  undefined1 auVar7 [16];
  cbtDbvtNode *pcVar8;
  cbtDbvtNode *pcVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  if (pdbvt->m_root == (cbtDbvtNode *)0x0) {
    pdbvt->m_root = leaf;
    leaf->parent = (cbtDbvtNode *)0x0;
  }
  else {
    pcVar8 = (root->field_2).childs[1];
    if (pcVar8 != (cbtDbvtNode *)0x0) {
      uVar2 = *(undefined8 *)(leaf->volume).mi.m_floats;
      uVar3 = *(undefined8 *)(leaf->volume).mx.m_floats;
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar11._0_4_ = (float)uVar2 + (float)uVar3;
      auVar11._4_4_ = (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar3 >> 0x20);
      auVar11._8_8_ = 0;
      fVar6 = (leaf->volume).mi.m_floats[2] + (leaf->volume).mx.m_floats[2];
      auVar12._4_4_ = fVar6;
      auVar12._0_4_ = fVar6;
      auVar12._8_4_ = fVar6;
      auVar12._12_4_ = fVar6;
      do {
        pcVar9 = (root->field_2).childs[0];
        uVar2 = *(undefined8 *)(pcVar8->volume).mx.m_floats;
        uVar3 = *(undefined8 *)(pcVar9->volume).mi.m_floats;
        uVar4 = *(undefined8 *)(pcVar9->volume).mx.m_floats;
        auVar14._0_4_ = (float)uVar3 + (float)uVar4;
        auVar14._4_4_ = (float)((ulong)uVar3 >> 0x20) + (float)((ulong)uVar4 >> 0x20);
        auVar14._8_8_ = 0;
        uVar3 = *(undefined8 *)(pcVar8->volume).mi.m_floats;
        auVar14 = vsubps_avx(auVar11,auVar14);
        auVar14 = vandps_avx(auVar14,auVar13);
        auVar16._0_4_ = (float)uVar3 + (float)uVar2;
        auVar16._4_4_ = (float)((ulong)uVar3 >> 0x20) + (float)((ulong)uVar2 >> 0x20);
        auVar16._8_8_ = 0;
        auVar7 = vinsertps_avx(ZEXT416((uint)(pcVar9->volume).mx.m_floats[2]),
                               ZEXT416((uint)(pcVar8->volume).mx.m_floats[2]),0x10);
        auVar15 = vsubps_avx(auVar11,auVar16);
        auVar15 = vandps_avx(auVar15,auVar13);
        auVar14 = vhaddps_avx(auVar14,auVar15);
        auVar15 = vinsertps_avx(ZEXT416((uint)(pcVar9->volume).mi.m_floats[2]),
                                ZEXT416((uint)(pcVar8->volume).mi.m_floats[2]),0x10);
        auVar16 = vshufps_avx(auVar14,auVar14,0xe8);
        auVar17._0_4_ = auVar15._0_4_ + auVar7._0_4_;
        auVar17._4_4_ = auVar15._4_4_ + auVar7._4_4_;
        auVar17._8_4_ = auVar15._8_4_ + auVar7._8_4_;
        auVar17._12_4_ = auVar15._12_4_ + auVar7._12_4_;
        auVar14 = vsubps_avx(auVar12,auVar17);
        auVar14 = vandps_avx(auVar14,auVar13);
        auVar15._0_4_ = auVar16._0_4_ + auVar14._0_4_;
        auVar15._4_4_ = auVar16._4_4_ + auVar14._4_4_;
        auVar15._8_4_ = auVar16._8_4_ + auVar14._8_4_;
        auVar15._12_4_ = auVar16._12_4_ + auVar14._12_4_;
        auVar14 = vmovshdup_avx(auVar15);
        root = *(cbtDbvtNode **)
                ((long)(&root->volume + 1) + ((ulong)(auVar14._0_4_ <= auVar15._0_4_) + 1) * 8);
        pcVar8 = (root->field_2).childs[1];
      } while (pcVar8 != (cbtDbvtNode *)0x0);
    }
    pcVar8 = root->parent;
    pcVar9 = pdbvt->m_free;
    if (pcVar9 == (cbtDbvtNode *)0x0) {
      pcVar9 = (cbtDbvtNode *)cbtAlignedAllocInternal(0x38,0x10);
      (pcVar9->volume).mi.m_floats[0] = 0.0;
      (pcVar9->volume).mi.m_floats[1] = 0.0;
      (pcVar9->volume).mi.m_floats[2] = 0.0;
      (pcVar9->volume).mi.m_floats[3] = 0.0;
      (pcVar9->volume).mx.m_floats[0] = 0.0;
      (pcVar9->volume).mx.m_floats[1] = 0.0;
      (pcVar9->volume).mx.m_floats[2] = 0.0;
      (pcVar9->volume).mx.m_floats[3] = 0.0;
      (pcVar9->volume).mx.m_floats[2] = 0.0;
      (pcVar9->volume).mx.m_floats[3] = 0.0;
      pcVar9->parent = (cbtDbvtNode *)0x0;
      (pcVar9->field_2).childs[0] = (cbtDbvtNode *)0x0;
      (pcVar9->field_2).childs[1] = (cbtDbvtNode *)0x0;
    }
    else {
      pdbvt->m_free = (cbtDbvtNode *)0x0;
    }
    lVar10 = 4;
    pcVar9->parent = pcVar8;
    (pcVar9->field_2).childs[0] = (cbtDbvtNode *)0x0;
    (pcVar9->field_2).childs[1] = (cbtDbvtNode *)0x0;
    do {
      auVar11 = vminss_avx(ZEXT416(*(uint *)((long)(&(leaf->volume).mi + -1) + lVar10 * 4)),
                           ZEXT416(*(uint *)((long)(&(root->volume).mi + -1) + lVar10 * 4)));
      *(int *)((long)(&(pcVar9->volume).mi + -1) + lVar10 * 4) = auVar11._0_4_;
      auVar11 = vmaxss_avx(ZEXT416((uint)(leaf->volume).mi.m_floats[lVar10]),
                           ZEXT416((uint)(root->volume).mi.m_floats[lVar10]));
      (pcVar9->volume).mi.m_floats[lVar10] = auVar11._0_4_;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 7);
    if (pcVar8 == (cbtDbvtNode *)0x0) {
      (pcVar9->field_2).childs[0] = root;
      root->parent = pcVar9;
      (pcVar9->field_2).childs[1] = leaf;
      leaf->parent = pcVar9;
      pdbvt->m_root = pcVar9;
    }
    else {
      *(cbtDbvtNode **)
       ((long)(&pcVar8->volume + 1) + ((ulong)((root->parent->field_2).childs[1] == root) + 1) * 8)
           = pcVar9;
      (pcVar9->field_2).childs[0] = root;
      root->parent = pcVar9;
      (pcVar9->field_2).childs[1] = leaf;
      leaf->parent = pcVar9;
      do {
        if (((((pcVar8->volume).mi.m_floats[0] <= (pcVar9->volume).mi.m_floats[0]) &&
             ((pcVar8->volume).mi.m_floats[1] <= (pcVar9->volume).mi.m_floats[1])) &&
            ((pcVar8->volume).mi.m_floats[2] <= (pcVar9->volume).mi.m_floats[2])) &&
           ((((pcVar9->volume).mx.m_floats[0] <= (pcVar8->volume).mx.m_floats[0] &&
             ((pcVar9->volume).mx.m_floats[1] <= (pcVar8->volume).mx.m_floats[1])) &&
            ((pcVar9->volume).mx.m_floats[2] <= (pcVar8->volume).mx.m_floats[2])))) {
          return;
        }
        pcVar9 = (pcVar8->field_2).childs[0];
        pcVar5 = (pcVar8->field_2).childs[1];
        lVar10 = 4;
        do {
          auVar11 = vminss_avx(ZEXT416(*(uint *)((long)(&(pcVar9->volume).mi + -1) + lVar10 * 4)),
                               ZEXT416(*(uint *)((long)(&(pcVar5->volume).mi + -1) + lVar10 * 4)));
          *(int *)((long)(&(pcVar8->volume).mi + -1) + lVar10 * 4) = auVar11._0_4_;
          auVar11 = vmaxss_avx(ZEXT416((uint)(pcVar9->volume).mi.m_floats[lVar10]),
                               ZEXT416((uint)(pcVar5->volume).mi.m_floats[lVar10]));
          (pcVar8->volume).mi.m_floats[lVar10] = auVar11._0_4_;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 7);
        ppcVar1 = &pcVar8->parent;
        pcVar9 = pcVar8;
        pcVar8 = *ppcVar1;
      } while (*ppcVar1 != (cbtDbvtNode *)0x0);
    }
  }
  return;
}

Assistant:

static void insertleaf(cbtDbvt* pdbvt,
					   cbtDbvtNode* root,
					   cbtDbvtNode* leaf)
{
	if (!pdbvt->m_root)
	{
		pdbvt->m_root = leaf;
		leaf->parent = 0;
	}
	else
	{
		if (!root->isleaf())
		{
			do
			{
				root = root->childs[Select(leaf->volume,
										   root->childs[0]->volume,
										   root->childs[1]->volume)];
			} while (!root->isleaf());
		}
		cbtDbvtNode* prev = root->parent;
		cbtDbvtNode* node = createnode(pdbvt, prev, leaf->volume, root->volume, 0);
		if (prev)
		{
			prev->childs[indexof(root)] = node;
			node->childs[0] = root;
			root->parent = node;
			node->childs[1] = leaf;
			leaf->parent = node;
			do
			{
				if (!prev->volume.Contain(node->volume))
					Merge(prev->childs[0]->volume, prev->childs[1]->volume, prev->volume);
				else
					break;
				node = prev;
			} while (0 != (prev = node->parent));
		}
		else
		{
			node->childs[0] = root;
			root->parent = node;
			node->childs[1] = leaf;
			leaf->parent = node;
			pdbvt->m_root = node;
		}
	}
}